

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

clockbounds_t * tchecker::clockbounds::compute_clockbounds(system_t *system)

{
  stored_size_type sVar1;
  clockbounds_t *this;
  
  this = (clockbounds_t *)operator_new(0x40);
  sVar1 = *(stored_size_type *)
           ((long)&(system->super_system_t).super_system_t.super_clocks_t._clock_variables.
                   super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._flattened_variables.
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8);
  if (sVar1 == *(stored_size_type *)
                ((long)&(system->super_system_t).super_system_t.super_clocks_t._clock_variables.
                        super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._flattened_variables.
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 0x20)) {
    clockbounds_t::clockbounds_t
              (this,(loc_id_t)
                    ((ulong)((long)*(pointer *)
                                    ((long)&(system->super_system_t).super_system_t.super_locs_t.
                                            _locs.
                                            super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            (long)(system->super_system_t).super_system_t.super_locs_t._locs.
                                  super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4),(clock_id_t)sVar1
              );
    compute_clockbounds(system,this);
    return this;
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

tchecker::clockbounds::clockbounds_t * compute_clockbounds(tchecker::ta::system_t const & system)
{
  tchecker::clockbounds::clockbounds_t * clockbounds = nullptr;
  try {
    clockbounds = new tchecker::clockbounds::clockbounds_t{
        static_cast<tchecker::loc_id_t>(system.locations_count()),
        static_cast<tchecker::clock_id_t>(system.clocks_count(tchecker::VK_FLATTENED))};

    tchecker::clockbounds::compute_clockbounds(system, *clockbounds);

    return clockbounds;
  }
  catch (...) {
    delete clockbounds;
    throw;
  }
}